

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmThrowErrorAp(jx9_vm *pVm,SyString *pFuncName,sxi32 iErr,char *zFormat,__va_list_tag *ap)

{
  SyBlob *pBlob;
  uint uVar1;
  sxu32 sVar2;
  char *pcVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *pData;
  sxu32 n;
  sxu32 local_34;
  
  if (pVm->bErrReport == 0) {
    return 0;
  }
  (pVm->sWorker).nByte = 0;
  uVar1 = (pVm->sWorker).nFlags;
  if ((uVar1 & 4) != 0) {
    (pVm->sWorker).pBlob = (void *)0x0;
    (pVm->sWorker).mByte = 0;
    (pVm->sWorker).nFlags = uVar1 & 0xfffffffb;
  }
  sVar2 = (pVm->aFiles).nUsed;
  if (sVar2 == 0) {
    puVar5 = (undefined8 *)0x0;
  }
  else {
    puVar5 = (undefined8 *)((ulong)((sVar2 - 1) * (pVm->aFiles).eSize) + (long)(pVm->aFiles).pBase);
  }
  pBlob = &pVm->sWorker;
  if (puVar5 != (undefined8 *)0x0) {
    SyBlobAppend(pBlob,(void *)*puVar5,*(sxu32 *)(puVar5 + 1));
    SyBlobAppend(pBlob," ",1);
  }
  pcVar6 = "Error: ";
  if (iErr == 3) {
    pcVar6 = "Notice: ";
  }
  pData = "Warning: ";
  if (iErr != 2) {
    pData = pcVar6;
  }
  pcVar6 = pData;
  if (*pData != '\0') {
    pcVar3 = pData + 2;
    do {
      pcVar6 = pcVar3;
      if (pcVar6[-1] == '\0') {
        pcVar6 = pcVar6 + -1;
        goto LAB_00120770;
      }
      if (*pcVar6 == '\0') goto LAB_00120770;
      if (pcVar6[1] == '\0') {
        pcVar6 = pcVar6 + 1;
        goto LAB_00120770;
      }
      pcVar3 = pcVar6 + 4;
    } while (pcVar6[2] != '\0');
    pcVar6 = pcVar6 + 2;
  }
LAB_00120770:
  SyBlobAppend(pBlob,pData,(int)pcVar6 - (int)pData);
  if (pFuncName != (SyString *)0x0) {
    SyBlobAppend(pBlob,pFuncName->zString,pFuncName->nByte);
    SyBlobAppend(pBlob,"(): ",4);
  }
  local_34 = 0;
  FormatMount(6,pBlob,(ProcConsumer)0x0,(void *)0x0,&local_34,zFormat,ap);
  SyBlobAppend(pBlob,"\n",1);
  iVar4 = (*(pVm->sVmConsumer).xConsumer)
                    ((pVm->sWorker).pBlob,(pVm->sWorker).nByte,(pVm->sVmConsumer).pUserData);
  pVm->nOutputLen = pVm->nOutputLen + (pVm->sWorker).nByte;
  return iVar4;
}

Assistant:

static sxi32 VmThrowErrorAp(
	jx9_vm *pVm,         /* Target VM */
	SyString *pFuncName, /* Function name. NULL otherwise */
	sxi32 iErr,          /* Severity level: [i.e: Error, Warning or Notice] */
	const char *zFormat, /* Format message */
	va_list ap           /* Variable list of arguments */
	)
{
	SyBlob *pWorker = &pVm->sWorker;
	SyString *pFile;
	char *zErr;
	sxi32 rc;
	if( !pVm->bErrReport ){
		/* Don't bother reporting errors */
		return SXRET_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Peek the processed file if available */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile ){
		/* Append file name */
		SyBlobAppend(pWorker, pFile->zString, pFile->nByte);
		SyBlobAppend(pWorker, (const void *)" ", sizeof(char));
	}
	zErr = "Error: ";
	switch(iErr){
	case JX9_CTX_WARNING: zErr = "Warning: "; break;
	case JX9_CTX_NOTICE:  zErr = "Notice: ";  break;
	default:
		iErr = JX9_CTX_ERR;
		break;
	}
	SyBlobAppend(pWorker, zErr, SyStrlen(zErr));
	if( pFuncName ){
		/* Append function name first */
		SyBlobAppend(pWorker, pFuncName->zString, pFuncName->nByte);
		SyBlobAppend(pWorker, "(): ", sizeof("(): ")-1);
	}
	SyBlobFormatAp(pWorker, zFormat, ap);
	/* Consume the error message */
	rc = VmCallErrorHandler(&(*pVm), pWorker);
	return rc;
}